

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Ref __thiscall cashew::ValueBuilder::makeFunction(ValueBuilder *this,IString name)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  Value *pVVar4;
  void *pvVar5;
  
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = Value::setArray(pVVar2,4);
  pvVar5 = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  (RVar3.inst)->type = Null;
  Value::free(RVar3.inst,pvVar5);
  (RVar3.inst)->type = String;
  pcVar1 = ::wasm::ABI::wasm2js::ATOMIC_WAIT_I32;
  ((RVar3.inst)->field_1).str.str._M_len = DEFUN;
  ((RVar3.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = Value::push_back(pVVar2,RVar3);
  pvVar5 = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  (RVar3.inst)->type = Null;
  Value::free(RVar3.inst,pvVar5);
  (RVar3.inst)->type = String;
  ((RVar3.inst)->field_1).arr = (ArrayStorage *)this;
  ((RVar3.inst)->field_1).str.str._M_str = (char *)name.str._M_len;
  pVVar2 = Value::push_back(pVVar2,RVar3);
  pVVar4 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  pVVar4->type = Null;
  RVar3.inst = Value::setArray(pVVar4,0);
  pVVar2 = Value::push_back(pVVar2,RVar3);
  pVVar4 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  pVVar4->type = Null;
  RVar3.inst = Value::setArray(pVVar4,0);
  RVar3.inst = Value::push_back(pVVar2,RVar3);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makeFunction(IString name) {
    return &makeRawArray(4)
              ->push_back(makeRawString(DEFUN))
              .push_back(makeRawString(name))
              .push_back(makeRawArray())
              .push_back(makeRawArray());
  }